

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qabstractscrollarea.cpp
# Opt level: O3

bool __thiscall QAbstractScrollArea::event(QAbstractScrollArea *this,QEvent *e)

{
  undefined8 uVar1;
  undefined8 uVar2;
  ushort uVar3;
  QAbstractScrollAreaPrivate *this_00;
  QWidget *pQVar4;
  QScrollBar *this_01;
  long lVar5;
  QAbstractSlider *pQVar6;
  QAbstractSlider *pQVar7;
  Representation RVar8;
  bool on;
  bool bVar9;
  char cVar10;
  undefined4 extraout_EAX;
  QAbstractScrollAreaPrivate *d_3;
  QPanGesture *this_02;
  QStyle *pQVar11;
  QPoint QVar12;
  QAbstractScrollAreaPrivate *d;
  ulong uVar13;
  QScrollEvent *se;
  QAbstractScrollAreaPrivate *d_1;
  long in_FS_OFFSET;
  double dVar14;
  double dVar15;
  int iVar16;
  int iVar19;
  double dVar17;
  double dVar18;
  Representation RVar20;
  int iVar23;
  undefined1 auVar21 [16];
  undefined1 auVar22 [16];
  QPointF QVar24;
  QPainter p;
  QStyleOption option;
  double local_98;
  undefined1 *local_80;
  undefined1 local_78 [16];
  undefined1 *local_68;
  undefined1 *puStack_60;
  undefined1 *local_58;
  QPalettePrivate *pQStack_50;
  undefined1 *local_48;
  QObject *pQStack_40;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QAbstractScrollAreaPrivate **)(this + 8);
  uVar3 = *(ushort *)(e + 8);
  if (99 < uVar3) {
    if (uVar3 < 0xc2) {
      if (uVar3 == 100) {
LAB_0038d30c:
        QAbstractScrollAreaPrivate::layoutChildren(this_00);
      }
      else {
        if (uVar3 == 0x6d) {
          QWidget::setAttribute
                    (this_00->viewport,WA_MouseTracking,
                     SUB41((*(uint *)(*(long *)(this + 0x20) + 8) & 4) >> 2,0));
          goto LAB_0038d6a9;
        }
        if (uVar3 == 0x98) {
          pQVar4 = this_00->viewport;
          bVar9 = true;
          if (pQVar4 != (QWidget *)0x0) {
            on = QWidget::acceptDrops((QWidget *)this);
            QWidget::setAcceptDrops(pQVar4,on);
          }
          goto switchD_0038d1e8_caseD_2;
        }
      }
      goto switchD_0038d1e8_caseD_6;
    }
    bVar9 = false;
    switch(uVar3) {
    case 0xc2:
    case 0xc3:
    case 0xc4:
      break;
    default:
      goto switchD_0038d1e8_caseD_6;
    case 0xc6:
      this_02 = (QPanGesture *)QGestureEvent::gesture((QGestureEvent *)e,PanGesture);
      if (this_02 == (QPanGesture *)0x0) {
LAB_0038d6cb:
        bVar9 = false;
      }
      else {
        pQVar6 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x288);
        pQVar7 = *(QAbstractSlider **)(*(long *)(this + 8) + 0x290);
        QVar24 = QPanGesture::delta(this_02);
        dVar14 = QVar24.yp;
        local_98 = QVar24.xp;
        bVar9 = true;
        if ((((local_98 != 0.0) || (NAN(local_98))) || (dVar14 != 0.0)) || (NAN(dVar14))) {
          iVar23 = QGuiApplication::layoutDirection();
          if (iVar23 == 1) {
            local_98 = -local_98;
          }
          iVar23 = QAbstractSlider::value(pQVar6);
          iVar16 = QAbstractSlider::value(pQVar7);
          QAbstractSlider::setValue(pQVar6,(int)((double)iVar23 - local_98));
          QAbstractSlider::setValue(pQVar7,(int)((double)iVar16 - dVar14));
        }
      }
      break;
    case 0xcc:
      dVar15 = (double)((ulong)*(double *)(e + 0x40) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x40);
      dVar14 = dVar15;
      if (dVar15 <= -2147483648.0) {
        dVar14 = -2147483648.0;
      }
      dVar18 = (double)((ulong)*(double *)(e + 0x48) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x48);
      dVar17 = dVar18;
      if (dVar18 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      local_78._4_4_ =
           (int)(double)(-(ulong)(2147483647.0 < dVar18) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar18) & (ulong)dVar17);
      local_78._0_4_ =
           (int)(double)(-(ulong)(2147483647.0 < dVar15) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar15) & (ulong)dVar14);
      cVar10 = (**(code **)(*(long *)&(this_00->super_QFramePrivate).super_QWidgetPrivate + 0xb0))
                         (this_00);
      if (cVar10 == '\0') goto LAB_0038d6cb;
      lVar5 = *(long *)(this + 8);
      pQVar6 = *(QAbstractSlider **)(lVar5 + 0x288);
      pQVar7 = *(QAbstractSlider **)(lVar5 + 0x290);
      lVar5 = *(long *)(*(long *)(lVar5 + 0x2b0) + 0x20);
      uVar1 = *(undefined8 *)(lVar5 + 0x1c);
      uVar2 = *(undefined8 *)(lVar5 + 0x14);
      local_78._8_8_ = (double)(((int)((ulong)uVar1 >> 0x20) - (int)((ulong)uVar2 >> 0x20)) + 1);
      local_78._0_8_ = (double)(((int)uVar1 - (int)uVar2) + 1);
      QScrollPrepareEvent::setViewportSize((QSizeF *)e);
      iVar23 = QAbstractSlider::maximum(pQVar6);
      iVar16 = QAbstractSlider::maximum(pQVar7);
      puStack_60 = (undefined1 *)(double)iVar16;
      local_78 = (undefined1  [16])0x0;
      local_68 = (undefined1 *)(double)iVar23;
      QScrollPrepareEvent::setContentPosRange((QRectF *)e);
      iVar23 = QAbstractSlider::value(pQVar6);
      iVar16 = QAbstractSlider::value(pQVar7);
      local_78._8_8_ = (double)iVar16;
      local_78._0_8_ = (double)iVar23;
      QScrollPrepareEvent::setContentPos((QPointF *)e);
      e[0xc] = (QEvent)0x1;
      goto LAB_0038d6a9;
    case 0xcd:
      this_01 = this_00->vbar;
      QAbstractSlider::setValue(&this_00->hbar->super_QAbstractSlider,(int)*(double *)(e + 0x10));
      QAbstractSlider::setValue(&this_01->super_QAbstractSlider,(int)*(double *)(e + 0x18));
      dVar14 = (double)((ulong)*(double *)(e + 0x20) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x20);
      dVar15 = (double)((ulong)*(double *)(e + 0x28) & 0x8000000000000000 | 0x3fe0000000000000) +
               *(double *)(e + 0x28);
      auVar21._8_8_ = dVar15;
      auVar21._0_8_ = dVar14;
      auVar21 = maxpd(auVar21,_DAT_006605e0);
      iVar16 = (int)(double)(~-(ulong)(2147483647.0 < dVar14) & auVar21._0_8_ |
                            -(ulong)(2147483647.0 < dVar14) & 0x41dfffffffc00000);
      iVar19 = (int)(double)(~-(ulong)(2147483647.0 < dVar15) & auVar21._8_8_ |
                            -(ulong)(2147483647.0 < dVar15) & 0x41dfffffffc00000);
      RVar20 = (this_00->overshoot).xp;
      RVar8 = (this_00->overshoot).yp;
      auVar22._0_4_ = -(uint)(RVar20.m_i == iVar16);
      iVar23 = -(uint)(RVar8.m_i == iVar19);
      auVar22._4_4_ = auVar22._0_4_;
      auVar22._8_4_ = iVar23;
      auVar22._12_4_ = iVar23;
      iVar23 = movmskpd(extraout_EAX,auVar22);
      if (iVar23 != 3) {
        pQVar4 = *(QWidget **)(*(long *)(this + 8) + 0x2b0);
        QVar12 = QWidget::pos(pQVar4);
        local_78._4_4_ = QVar12.yp.m_i.m_i + (RVar8.m_i - iVar19);
        local_78._0_4_ = QVar12.xp.m_i.m_i + (RVar20.m_i - iVar16);
        QWidget::move(pQVar4,(QPoint *)local_78);
        dVar14 = (double)((ulong)*(double *)(e + 0x20) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x20);
        dVar15 = (double)((ulong)*(double *)(e + 0x28) & 0x8000000000000000 | 0x3fe0000000000000) +
                 *(double *)(e + 0x28);
      }
      dVar17 = dVar14;
      if (dVar14 <= -2147483648.0) {
        dVar17 = -2147483648.0;
      }
      QVar12.xp.m_i =
           (int)(double)(-(ulong)(2147483647.0 < dVar14) & 0x41dfffffffc00000 |
                        ~-(ulong)(2147483647.0 < dVar14) & (ulong)dVar17);
      bVar9 = 2147483647.0 < dVar15;
      if (dVar15 <= -2147483648.0) {
        dVar15 = -2147483648.0;
      }
      QVar12.yp.m_i =
           (int)(double)(-(ulong)bVar9 & 0x41dfffffffc00000 | ~-(ulong)bVar9 & (ulong)dVar15);
      this_00->overshoot = QVar12;
LAB_0038d6a9:
      bVar9 = true;
    }
    goto switchD_0038d1e8_caseD_2;
  }
  uVar13 = (ulong)(uVar3 - 0x1f);
  if (uVar3 - 0x1f < 0x3c) {
    bVar9 = false;
    if ((0x1e0000001U >> (uVar13 & 0x3f) & 1) != 0) goto switchD_0038d1e8_caseD_2;
    if ((0x800200000000040U >> (uVar13 & 0x3f) & 1) != 0) goto LAB_0038d30c;
    if (uVar13 == 0x33) {
      if (e[0x38] != (QEvent)0x1) {
        e[0xc] = (QEvent)0x0;
        goto LAB_0038d6a9;
      }
      goto switchD_0038d1e8_caseD_6;
    }
  }
  bVar9 = false;
  switch(uVar3) {
  case 0xc:
    local_48 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_40 = (QObject *)&DAT_aaaaaaaaaaaaaaaa;
    local_58 = &DAT_aaaaaaaaaaaaaaaa;
    pQStack_50 = (QPalettePrivate *)&DAT_aaaaaaaaaaaaaaaa;
    local_68 = &DAT_aaaaaaaaaaaaaaaa;
    puStack_60 = &DAT_aaaaaaaaaaaaaaaa;
    local_78._8_8_ = &DAT_aaaaaaaaaaaaaaaa;
    local_78._0_8_ = &DAT_aaaaaaaaaaaaaaaa;
    QStyleOption::QStyleOption((QStyleOption *)local_78,1,0);
    QStyleOption::initFrom((QStyleOption *)local_78,(QWidget *)this);
    if (((this_00->cornerPaintingRect).x1.m_i <= (this_00->cornerPaintingRect).x2.m_i) &&
       ((this_00->cornerPaintingRect).y1.m_i <= (this_00->cornerPaintingRect).y2.m_i)) {
      local_68 = *(undefined1 **)&this_00->cornerPaintingRect;
      puStack_60 = *(undefined1 **)&(this_00->cornerPaintingRect).x2;
      local_80 = &DAT_aaaaaaaaaaaaaaaa;
      QPainter::QPainter((QPainter *)&local_80,(QPaintDevice *)(this + 0x10));
      pQVar11 = QWidget::style((QWidget *)this);
      (**(code **)(*(long *)pQVar11 + 0xb0))(pQVar11,0x28,local_78,(QPainter *)&local_80,this);
      QPainter::~QPainter((QPainter *)&local_80);
    }
    QStyleOption::~QStyleOption((QStyleOption *)local_78);
    QFrame::paintEvent((QFrame *)this,(QPaintEvent *)e);
    goto LAB_0038d6a9;
  case 0xe:
    bVar9 = true;
    if (this_00->inResize == false) {
      this_00->inResize = true;
      QAbstractScrollAreaPrivate::layoutChildren(this_00);
      this_00->inResize = false;
    }
  case 2:
  case 3:
  case 4:
  case 5:
switchD_0038d1e8_caseD_2:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      return bVar9;
    }
    break;
  case 0x11:
    if ((this_00->shownOnce == false) && (this_00->sizeAdjustPolicy == AdjustToContentsOnFirstShow))
    {
      (this_00->sizeHint).wd = -1;
      (this_00->sizeHint).ht = -1;
      QWidget::updateGeometry((QWidget *)this);
    }
    this_00->shownOnce = true;
  default:
switchD_0038d1e8_caseD_6:
    if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
      bVar9 = QFrame::event((QFrame *)this,e);
      return bVar9;
    }
  }
  __stack_chk_fail();
}

Assistant:

bool QAbstractScrollArea::event(QEvent *e)
{
    Q_D(QAbstractScrollArea);
    switch (e->type()) {
    case QEvent::AcceptDropsChange:
        // There was a chance that with accessibility client we get an
        // event before the viewport was created.
        // Also, in some cases we might get here from QWidget::event() virtual function which is (indirectly) called
        // from the viewport constructor at the time when the d->viewport is not yet initialized even without any
        // accessibility client. See qabstractscrollarea autotest for a test case.
        if (d->viewport)
            d->viewport->setAcceptDrops(acceptDrops());
        break;
    case QEvent::MouseTrackingChange:
        d->viewport->setMouseTracking(hasMouseTracking());
        break;
    case QEvent::Resize:
        if (!d->inResize) {
            d->inResize = true;
            d->layoutChildren();
            d->inResize = false;
        }
        break;
    case QEvent::Show:
        if (!d->shownOnce && d->sizeAdjustPolicy == QAbstractScrollArea::AdjustToContentsOnFirstShow) {
            d->sizeHint = QSize();
            updateGeometry();
        }
        d->shownOnce = true;
        return QFrame::event(e);
    case QEvent::Paint: {
        QStyleOption option;
        option.initFrom(this);
        if (d->cornerPaintingRect.isValid()) {
            option.rect = d->cornerPaintingRect;
            QPainter p(this);
            style()->drawPrimitive(QStyle::PE_PanelScrollAreaCorner, &option, &p, this);
        }
        }
        QFrame::paintEvent((QPaintEvent*)e);
        break;
#ifndef QT_NO_CONTEXTMENU
    case QEvent::ContextMenu:
        if (static_cast<QContextMenuEvent *>(e)->reason() == QContextMenuEvent::Keyboard)
           return QFrame::event(e);
        e->ignore();
        break;
#endif // QT_NO_CONTEXTMENU
    case QEvent::MouseButtonPress:
    case QEvent::MouseButtonRelease:
    case QEvent::MouseButtonDblClick:
    case QEvent::MouseMove:
    case QEvent::Wheel:
#if QT_CONFIG(draganddrop)
    case QEvent::Drop:
    case QEvent::DragEnter:
    case QEvent::DragMove:
    case QEvent::DragLeave:
#endif
        // ignore touch events in case they have been propagated from the viewport
    case QEvent::TouchBegin:
    case QEvent::TouchUpdate:
    case QEvent::TouchEnd:
        return false;
#ifndef QT_NO_GESTURES
    case QEvent::Gesture:
    {
        QGestureEvent *ge = static_cast<QGestureEvent *>(e);
        QPanGesture *g = static_cast<QPanGesture *>(ge->gesture(Qt::PanGesture));
        if (g) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();
            QPointF delta = g->delta();
            if (!delta.isNull()) {
                if (QGuiApplication::isRightToLeft())
                    delta.rx() *= -1;
                int newX = hBar->value() - delta.x();
                int newY = vBar->value() - delta.y();
                hBar->setValue(newX);
                vBar->setValue(newY);
            }
            return true;
        }
        return false;
    }
#endif // QT_NO_GESTURES
    case QEvent::ScrollPrepare:
    {
        QScrollPrepareEvent *se = static_cast<QScrollPrepareEvent *>(e);
        if (d->canStartScrollingAt(se->startPos().toPoint())) {
            QScrollBar *hBar = horizontalScrollBar();
            QScrollBar *vBar = verticalScrollBar();

            se->setViewportSize(QSizeF(viewport()->size()));
            se->setContentPosRange(QRectF(0, 0, hBar->maximum(), vBar->maximum()));
            se->setContentPos(QPointF(hBar->value(), vBar->value()));
            se->accept();
            return true;
        }
        return false;
    }
    case QEvent::Scroll:
    {
        QScrollEvent *se = static_cast<QScrollEvent *>(e);

        QScrollBar *hBar = horizontalScrollBar();
        QScrollBar *vBar = verticalScrollBar();
        hBar->setValue(se->contentPos().x());
        vBar->setValue(se->contentPos().y());

        QPoint delta = d->overshoot - se->overshootDistance().toPoint();
        if (!delta.isNull())
            viewport()->move(viewport()->pos() + delta);

        d->overshoot = se->overshootDistance().toPoint();

        return true;
    }
    case QEvent::StyleChange:
    case QEvent::LayoutDirectionChange:
    case QEvent::ApplicationLayoutDirectionChange:
    case QEvent::LayoutRequest:
        d->layoutChildren();
        Q_FALLTHROUGH();
    default:
        return QFrame::event(e);
    }
    return true;
}